

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

ReduceL1LayerParams * __thiscall
CoreML::Specification::ReduceL1LayerParams::New(ReduceL1LayerParams *this,Arena *arena)

{
  ReduceL1LayerParams *this_00;
  
  this_00 = (ReduceL1LayerParams *)operator_new(0x30);
  ReduceL1LayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ReduceL1LayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ReduceL1LayerParams* ReduceL1LayerParams::New(::google::protobuf::Arena* arena) const {
  ReduceL1LayerParams* n = new ReduceL1LayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}